

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall
TPZFront<std::complex<double>_>::TPZFront
          (TPZFront<std::complex<double>_> *this,void **vtt,int64_t GlobalSize)

{
  long *plVar1;
  long in_RDX;
  undefined8 *in_RSI;
  TPZManVector<long,_10> *in_RDI;
  int64_t i;
  int64_t *this_00;
  int64_t *newsize;
  TPZVec<long> *in_stack_ffffffffffffffd0;
  long index;
  
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,(void **)(in_RSI + 1));
  (in_RDI->super_TPZVec<long>)._vptr_TPZVec = (_func_int **)*in_RSI;
  newsize = &(in_RDI->super_TPZVec<long>).fNElements;
  TPZManVector<long,_10>::TPZManVector(in_RDI,(int64_t)in_RSI);
  this_00 = &in_RDI[1].super_TPZVec<long>.fNElements;
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)this_00);
  TPZVec<std::complex<double>_>::TPZVec
            ((TPZVec<std::complex<double>_> *)&in_RDI[2].super_TPZVec<long>.fNAlloc);
  *(undefined4 *)(in_RDI[2].fExtAlloc + 3) = 200;
  in_RDI[1].fExtAlloc[2] = 0;
  *(undefined4 *)((long)&(in_RDI->super_TPZVec<long>).fStore + 4) = 0;
  TPZVec<long>::Resize(in_stack_ffffffffffffffd0,(int64_t)newsize);
  for (index = 0; index < in_RDX; index = index + 1) {
    plVar1 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)&in_RDI[1].super_TPZVec<long>.fNElements,index);
    *plVar1 = -1;
  }
  *(undefined4 *)&(in_RDI->super_TPZVec<long>).fStore = 0;
  in_RDI[1].fExtAlloc[3] = in_RDX;
  in_RDI[2].fExtAlloc[4] = 0;
  *(undefined4 *)((long)in_RDI[2].fExtAlloc + 0x1c) = 1;
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(int64_t GlobalSize)
{
	fExpandRatio = 200;
	fFront = 0;
	fMaxFront=0;
	fLocal.Resize(GlobalSize);
	int64_t i;
	for(i=0;i<GlobalSize;i++) fLocal[i]=-1;
	fWork = 0;
	fNextRigidBodyMode = GlobalSize;
	fProductMTData = NULL;
    fDecomposeType = ELU;
}